

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O0

void __thiscall nv::Path::translatePath(Path *this)

{
  int iVar1;
  int local_14;
  int i;
  Path *this_local;
  
  if (((this->super_StringBuilder).m_str == (char *)0x0) &&
     (iVar1 = nvAbort("m_str != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x1c8,"void nv::Path::translatePath()"), iVar1 == 1)) {
    raise(5);
  }
  for (local_14 = 0; (this->super_StringBuilder).m_str[local_14] != '\0'; local_14 = local_14 + 1) {
    if ((this->super_StringBuilder).m_str[local_14] == '\\') {
      (this->super_StringBuilder).m_str[local_14] = '/';
    }
  }
  return;
}

Assistant:

void Path::translatePath()
{
	nvCheck( m_str != NULL );

	for(int i = 0; ; i++) {
		if( m_str[i] == '\0' ) break;
#if NV_PATH_SEPARATOR == '/'
		if( m_str[i] == '\\' ) m_str[i] = NV_PATH_SEPARATOR;
#else
		if( m_str[i] == '/' ) m_str[i] = NV_PATH_SEPARATOR;
#endif
	}
}